

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          ,TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *object)

{
  ulong uVar1;
  TPZReference *pTVar2;
  ostream *poVar3;
  ulong *puVar4;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar5;
  ulong uVar6;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
    if (lVar8 != newsize) {
      lVar9 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc;
      if (lVar9 < newsize) {
        if ((ulong)newsize < 0x15) {
          pTVar5 = this->fExtAlloc;
          lVar9 = 0;
          for (lVar10 = 0; lVar10 < lVar8; lVar10 = lVar10 + 1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&pTVar5->fRef + lVar9),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar9));
            lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                    fNElements;
            lVar9 = lVar9 + 8;
          }
          lVar8 = lVar10;
          if (lVar10 < newsize) {
            lVar8 = newsize;
          }
          pTVar7 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                   ((long)&pTVar5->fRef + lVar9);
          for (; lVar10 != lVar8; lVar8 = lVar8 + -1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar7,object);
            pTVar7 = pTVar7 + 1;
          }
          pTVar7 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
          if (pTVar7 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 && pTVar7 != pTVar5
             ) {
            pTVar2 = pTVar7[-1].fRef;
            if (pTVar2 != (TPZReference *)0x0) {
              lVar8 = (long)pTVar2 * 8;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                           ((long)&pTVar7[-1].fRef + lVar8));
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar7 + -1,(long)pTVar2 * 8 + 8);
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore = pTVar5;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0x14;
        }
        else {
          dVar12 = (double)lVar9 * 1.2;
          uVar11 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar11 = newsize;
          }
          uVar1 = uVar11 * 8;
          uVar6 = 0xffffffffffffffff;
          if (uVar1 < 0xfffffffffffffff8) {
            uVar6 = uVar1 + 8;
          }
          puVar4 = (ulong *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar6);
          *puVar4 = uVar11;
          pTVar5 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar4 + 1);
          if (uVar11 != 0) {
            lVar8 = 0;
            pTVar7 = pTVar5;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::TPZAutoPointer(pTVar7);
              lVar8 = lVar8 + -8;
              pTVar7 = pTVar7 + 1;
            } while (-lVar8 != uVar1);
          }
          lVar9 = 0;
          for (lVar8 = 0;
              lVar8 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                      fNElements; lVar8 = lVar8 + 1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&pTVar5->fRef + lVar9),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar9));
            lVar9 = lVar9 + 8;
          }
          lVar10 = lVar8;
          if (lVar8 < newsize) {
            lVar10 = newsize;
          }
          pTVar7 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                   ((long)&pTVar5->fRef + lVar9);
          for (; lVar8 != lVar10; lVar10 = lVar10 + -1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar7,object);
            pTVar7 = pTVar7 + 1;
          }
          pTVar7 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
          if (pTVar7 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
              pTVar7 != this->fExtAlloc) {
            pTVar2 = pTVar7[-1].fRef;
            if (pTVar2 != (TPZReference *)0x0) {
              lVar8 = (long)pTVar2 * 8;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                           ((long)&pTVar7[-1].fRef + lVar8));
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar7 + -1,(long)pTVar2 * 8 + 8);
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore = pTVar5;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar11;
        }
      }
      else {
        lVar9 = lVar8 * 8;
        for (; lVar8 < newsize; lVar8 = lVar8 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                     ((long)&((this->
                              super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                             fStore)->fRef + lVar9),object);
          lVar9 = lVar9 + 8;
        }
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}